

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O2

lzma_ret lzma_lzma_encode(lzma_coder_conflict9 *coder,lzma_mf *mf,uint8_t *out,size_t *out_pos,
                         size_t out_size,uint32_t limit)

{
  byte bVar1;
  byte bVar2;
  lzma_lzma_state lVar3;
  uint32_t uVar4;
  uint8_t *puVar5;
  _Bool _Var6;
  uint32_t uVar7;
  uint uVar8;
  size_t sVar9;
  uint uVar10;
  lzma_lzma_state lVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  bool bVar18;
  uint32_t len;
  uint32_t back;
  probability (*local_80) [16];
  probability *local_78;
  probability *local_70;
  uint8_t *local_68;
  size_t local_60;
  probability *local_58;
  probability (*local_50) [16];
  lzma_length_encoder *local_48;
  probability *local_40;
  probability (*local_38) [768];
  
  local_68 = out;
  local_60 = out_size;
  if (coder->is_initialized == true) {
    uVar7 = mf->read_ahead;
  }
  else {
    uVar7 = mf->read_pos;
    if (uVar7 != mf->read_ahead) {
      __assert_fail("mf_position(mf) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                    ,0x117,"_Bool encode_init(lzma_coder *, lzma_mf *)");
    }
    if (uVar7 == mf->read_limit) {
      if (mf->action == LZMA_RUN) {
        return LZMA_OK;
      }
      if (mf->write_pos != uVar7) {
        __assert_fail("mf->write_pos == mf->read_pos",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                      ,0x11e,"_Bool encode_init(lzma_coder *, lzma_mf *)");
      }
      if (mf->action != LZMA_FINISH) {
        __assert_fail("mf->action == LZMA_FINISH",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                      ,0x11f,"_Bool encode_init(lzma_coder *, lzma_mf *)");
      }
    }
    else {
      (*mf->skip)(mf,1);
      mf->read_ahead = 0;
      sVar9 = (coder->rc).count;
      (coder->rc).symbols[sVar9] = RC_BIT_0;
      (coder->rc).probs[sVar9] = coder->is_match[0];
      (coder->rc).count = sVar9 + 1;
      rc_bittree(&coder->rc,coder->literal[0],8,(uint)*mf->buffer);
      uVar7 = 0;
    }
    coder->is_initialized = true;
  }
  uVar17 = mf->read_pos - uVar7;
  local_80 = coder->is_match;
  local_70 = coder->is_rep;
  local_78 = coder->is_rep0;
  local_40 = coder->is_rep1;
  local_58 = coder->is_rep2;
  local_50 = coder->is_rep0_long;
  local_48 = &coder->rep_len_encoder;
  local_38 = coder->literal;
  do {
    _Var6 = rc_encode(&coder->rc,local_68,out_pos,local_60);
    if (_Var6) {
      if (limit == 0xffffffff) {
        return LZMA_OK;
      }
      __assert_fail("limit == UINT32_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                    ,0x159,
                    "lzma_ret lzma_lzma_encode(lzma_coder *restrict, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t, uint32_t)"
                   );
    }
    if ((limit != 0xffffffff) &&
       ((limit <= mf->read_pos - mf->read_ahead || (0xeffe < *out_pos + (coder->rc).cache_size + 4))
       )) {
LAB_00411b33:
      if (coder->is_flushed == false) {
        coder->is_flushed = true;
        if (limit == 0xffffffff) {
          uVar17 = uVar17 & coder->pos_mask;
          lVar3 = coder->state;
          sVar9 = (coder->rc).count;
          (coder->rc).symbols[sVar9] = RC_BIT_1;
          (coder->rc).probs[sVar9] = local_80[lVar3] + uVar17;
          lVar3 = coder->state;
          (coder->rc).symbols[sVar9 + 1] = RC_BIT_0;
          (coder->rc).probs[sVar9 + 1] = local_70 + lVar3;
          (coder->rc).count = sVar9 + 2;
          match(coder,uVar17,0xffffffff,2);
        }
        sVar9 = (coder->rc).count;
        lVar12 = 5;
        while (bVar18 = lVar12 != 0, lVar12 = lVar12 + -1, bVar18) {
          (coder->rc).symbols[sVar9] = RC_FLUSH;
          sVar9 = sVar9 + 1;
        }
        (coder->rc).count = sVar9;
        _Var6 = rc_encode(&coder->rc,local_68,out_pos,local_60);
        if (_Var6) {
          if (limit == 0xffffffff) {
            return LZMA_OK;
          }
          __assert_fail("limit == UINT32_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                        ,0x194,
                        "lzma_ret lzma_lzma_encode(lzma_coder *restrict, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t, uint32_t)"
                       );
        }
      }
      coder->is_flushed = false;
      return LZMA_STREAM_END;
    }
    if (mf->read_limit <= mf->read_pos) {
      if (mf->action == LZMA_RUN) {
        return LZMA_OK;
      }
      if (mf->read_ahead == 0) goto LAB_00411b33;
    }
    if (coder->fast_mode == true) {
      lzma_lzma_optimum_fast(coder,mf,&back,&len);
    }
    else {
      lzma_lzma_optimum_normal(coder,mf,&back,&len,uVar17);
    }
    uVar7 = len;
    uVar14 = (ulong)back;
    uVar8 = coder->pos_mask & uVar17;
    if (uVar14 == 0xffffffff) {
      if (len != 1) {
        __assert_fail("len == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                      ,0xfa,
                      "void encode_symbol(lzma_coder *, lzma_mf *, uint32_t, uint32_t, uint32_t)");
      }
      lVar3 = coder->state;
      sVar9 = (coder->rc).count;
      (coder->rc).symbols[sVar9] = RC_BIT_0;
      (coder->rc).probs[sVar9] = local_80[lVar3] + uVar8;
      (coder->rc).count = sVar9 + 1;
      puVar5 = mf->buffer;
      uVar16 = mf->read_pos - mf->read_ahead;
      uVar8 = coder->literal_pos_mask;
      bVar1 = (byte)coder->literal_context_bits;
      bVar2 = puVar5[uVar16 - 1];
      if (coder->state < STATE_LIT_MATCH) {
        rc_bittree(&coder->rc,
                   local_38[(uint)(bVar2 >> (8 - bVar1 & 0x1f)) +
                            ((uVar8 & uVar17) << (bVar1 & 0x1f))],8,(uint)puVar5[uVar16]);
      }
      else {
        uVar10 = (uint)puVar5[uVar16 + ~coder->reps[0]];
        uVar13 = 0x100;
        lVar12 = sVar9 + 0x23;
        uVar16 = puVar5[uVar16] | 0x100;
        do {
          lVar15 = lVar12;
          uVar10 = uVar10 * 2;
          *(uint *)((long)coder + lVar15 * 4 + -0x60) = uVar16 >> 7 & 1;
          *(probability **)((coder->rc).symbols + lVar15 * 2 + -10) =
               local_38[(uint)(bVar2 >> (8 - bVar1 & 0x1f)) + ((uVar8 & uVar17) << (bVar1 & 0x1f))]
               + ((uVar16 >> 8) + uVar13 + (uVar10 & uVar13));
          uVar13 = uVar13 & ~(uVar16 * 2 ^ uVar10);
          bVar18 = uVar16 < 0x8000;
          lVar12 = lVar15 + 1;
          uVar16 = uVar16 * 2;
        } while (bVar18);
        (coder->rc).count = lVar15 - 0x21;
      }
      lVar3 = coder->state;
      lVar11 = STATE_LIT_LIT;
      if (STATE_SHORTREP_LIT_LIT < lVar3) {
        if (lVar3 < STATE_NONLIT_MATCH) {
          lVar11 = lVar3 - STATE_SHORTREP_LIT_LIT;
        }
        else {
          lVar11 = lVar3 - STATE_SHORTREP_LIT;
        }
      }
LAB_00411b14:
      coder->state = lVar11;
    }
    else {
      lVar3 = coder->state;
      sVar9 = (coder->rc).count;
      (coder->rc).symbols[sVar9] = RC_BIT_1;
      (coder->rc).probs[sVar9] = local_80[lVar3] + uVar8;
      lVar3 = coder->state;
      if (back < 4) {
        (coder->rc).symbols[sVar9 + 1] = RC_BIT_1;
        (coder->rc).probs[sVar9 + 1] = local_70 + lVar3;
        if (uVar14 == 0) {
          lVar3 = coder->state;
          (coder->rc).symbols[sVar9 + 2] = RC_BIT_0;
          (coder->rc).probs[sVar9 + 2] = local_78 + lVar3;
          lVar3 = coder->state;
          (coder->rc).symbols[sVar9 + 3] = (uint)(len != 1);
          (coder->rc).probs[sVar9 + 3] = local_50[lVar3] + uVar8;
          (coder->rc).count = sVar9 + 4;
        }
        else {
          uVar4 = coder->reps[uVar14];
          lVar3 = coder->state;
          (coder->rc).symbols[sVar9 + 2] = RC_BIT_1;
          (coder->rc).probs[sVar9 + 2] = local_78 + lVar3;
          lVar3 = coder->state;
          if (uVar14 == 1) {
            (coder->rc).symbols[sVar9 + 3] = RC_BIT_0;
            (coder->rc).probs[sVar9 + 3] = local_40 + lVar3;
            (coder->rc).count = sVar9 + 4;
          }
          else {
            (coder->rc).symbols[sVar9 + 3] = RC_BIT_1;
            (coder->rc).probs[sVar9 + 3] = local_40 + lVar3;
            lVar3 = coder->state;
            (coder->rc).symbols[sVar9 + 4] = back - RC_DIRECT_0;
            (coder->rc).probs[sVar9 + 4] = local_58 + lVar3;
            (coder->rc).count = sVar9 + 5;
            if (uVar14 == 3) {
              coder->reps[3] = coder->reps[2];
            }
            coder->reps[2] = coder->reps[1];
          }
          coder->reps[1] = coder->reps[0];
          coder->reps[0] = uVar4;
        }
        lVar11 = STATE_LIT_SHORTREP;
        if (len != 1) {
          length(&coder->rc,local_48,uVar8,len,coder->fast_mode);
          lVar11 = STATE_LIT_LONGREP;
        }
        if (STATE_SHORTREP_LIT < coder->state) {
          lVar11 = STATE_NONLIT_REP;
        }
        goto LAB_00411b14;
      }
      (coder->rc).symbols[sVar9 + 1] = RC_BIT_0;
      (coder->rc).probs[sVar9 + 1] = local_70 + lVar3;
      (coder->rc).count = sVar9 + 2;
      match(coder,uVar8,back - 4,len);
    }
    if (mf->read_ahead < uVar7) {
      __assert_fail("mf->read_ahead >= len",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                    ,0x10f,
                    "void encode_symbol(lzma_coder *, lzma_mf *, uint32_t, uint32_t, uint32_t)");
    }
    mf->read_ahead = mf->read_ahead - uVar7;
    uVar17 = uVar17 + len;
  } while( true );
}

Assistant:

extern lzma_ret
lzma_lzma_encode(lzma_coder *LZMA_RESTRICT coder, lzma_mf *LZMA_RESTRICT mf,
		uint8_t *LZMA_RESTRICT out, size_t *LZMA_RESTRICT out_pos,
		size_t out_size, uint32_t limit)
{
	uint32_t position;

	// Initialize the stream if no data has been encoded yet.
	if (!coder->is_initialized && !encode_init(coder, mf))
		return LZMA_OK;

	// Get the lowest bits of the uncompressed offset from the LZ layer.
	position = mf_position(mf);

	while (true) {
		uint32_t len;
		uint32_t back;

		// Encode pending bits, if any. Calling this before encoding
		// the next symbol is needed only with plain LZMA, since
		// LZMA2 always provides big enough buffer to flush
		// everything out from the range encoder. For the same reason,
		// rc_encode() never returns true when this function is used
		// as part of LZMA2 encoder.
		if (rc_encode(&coder->rc, out, out_pos, out_size)) {
			assert(limit == UINT32_MAX);
			return LZMA_OK;
		}

		// With LZMA2 we need to take care that compressed size of
		// a chunk doesn't get too big.
		// FIXME? Check if this could be improved.
		if (limit != UINT32_MAX
				&& (mf->read_pos - mf->read_ahead >= limit
					|| *out_pos + rc_pending(&coder->rc)
						>= LZMA2_CHUNK_MAX
							- LOOP_INPUT_MAX))
			break;

		// Check that there is some input to process.
		if (mf->read_pos >= mf->read_limit) {
			if (mf->action == LZMA_RUN)
				return LZMA_OK;

			if (mf->read_ahead == 0)
				break;
		}

		// Get optimal match (repeat position and length).
		// Value ranges for pos:
		//   - [0, REP_DISTANCES): repeated match
		//   - [REP_DISTANCES, UINT32_MAX):
		//     match at (pos - REP_DISTANCES)
		//   - UINT32_MAX: not a match but a literal
		// Value ranges for len:
		//   - [MATCH_LEN_MIN, MATCH_LEN_MAX]

		if (coder->fast_mode)
			lzma_lzma_optimum_fast(coder, mf, &back, &len);
		else
			lzma_lzma_optimum_normal(
					coder, mf, &back, &len, position);

		encode_symbol(coder, mf, back, len, position);

		position += len;
	}

	if (!coder->is_flushed) {
		coder->is_flushed = true;

		// We don't support encoding plain LZMA streams without EOPM,
		// and LZMA2 doesn't use EOPM at LZMA level.
		if (limit == UINT32_MAX)
			encode_eopm(coder, position);

		// Flush the remaining bytes from the range encoder.
		rc_flush(&coder->rc);

		// Copy the remaining bytes to the output buffer. If there
		// isn't enough output space, we will copy out the remaining
		// bytes on the next call to this function by using
		// the rc_encode() call in the encoding loop above.
		if (rc_encode(&coder->rc, out, out_pos, out_size)) {
			assert(limit == UINT32_MAX);
			return LZMA_OK;
		}
	}

	// Make it ready for the next LZMA2 chunk.
	coder->is_flushed = false;

	return LZMA_STREAM_END;
}